

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2protocol.cpp
# Opt level: O1

void Http2::appendProtocolUpgradeHeaders(QHttp2Configuration *config,QHttpNetworkRequest *request)

{
  QByteArray *pQVar1;
  long in_FS_OFFSET;
  QByteArray local_c8;
  QByteArray local_b0;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&>,_const_char_(&)[24]>
  local_98;
  QByteArrayView local_78;
  QByteArray local_68;
  QArrayData *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_48 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)0x0;
  local_68.d.ptr = (char *)0x0;
  local_68.d.size = 0;
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[9])
            ((QArrayData *)&local_48,request,10,"Connection",&local_68);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_38 == (undefined1 *)0x0) {
    local_78.m_size = 0;
    local_78.m_data = (char *)0x0;
  }
  else {
    local_78.m_size = 2;
    local_78.m_data = ", ";
  }
  local_68.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_68.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  local_98.a.b = &local_78;
  local_98.b = (char (*) [24])0x269fc9;
  local_98.a.a = (QByteArray *)&local_48;
  QStringBuilder<QStringBuilder<const_QByteArray_&,_const_QByteArrayView_&>,_const_char_(&)[24]>::
  convertTo<QByteArray>(&local_68,&local_98);
  QByteArray::QByteArray((QByteArray *)&local_98,"Connection",-1);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_98,&local_68);
  pQVar1 = local_98.a.a;
  if ((QArrayData *)local_98.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&pQVar1->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98.a.a,1,0x10);
    }
  }
  QByteArray::QByteArray((QByteArray *)&local_98,"Upgrade",-1);
  QByteArray::QByteArray(&local_b0,"h2c",-1);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_98,&local_b0);
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,1,0x10);
    }
  }
  if ((QArrayData *)local_98.a.a != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_98.a.a)->d)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_98.a.a,1,0x10);
    }
  }
  local_98.b = (char (*) [24])&DAT_aaaaaaaaaaaaaaaa;
  local_98.a.a = (QByteArray *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.a.b = (QByteArrayView *)&DAT_aaaaaaaaaaaaaaaa;
  configurationToSettingsFrame((Frame *)&local_98,config);
  QByteArray::QByteArray(&local_b0,"HTTP2-Settings",-1);
  settingsFrameToBase64(&local_c8,(Frame *)&local_98);
  (*(request->super_QHttpNetworkHeader)._vptr_QHttpNetworkHeader[10])(request,&local_b0,&local_c8);
  if (&(local_c8.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_c8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_c8.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (&(local_b0.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_98.a.a != (QByteArray *)0x0) {
    operator_delete(local_98.a.a,(long)local_98.b - (long)local_98.a.a);
  }
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,1,0x10);
    }
  }
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,1,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendProtocolUpgradeHeaders(const QHttp2Configuration &config, QHttpNetworkRequest *request)
{
    Q_ASSERT(request);
    // RFC 2616, 14.10
    // RFC 7540, 3.2
    const QByteArray connectionHeader = request->headerField("Connection");
    const auto separator = connectionHeader.isEmpty() ? QByteArrayView() : QByteArrayView(", ");
    // We _append_ 'Upgrade':
    QByteArray value = connectionHeader + separator + "Upgrade, HTTP2-Settings";
    request->setHeaderField("Connection", value);
    // This we just (re)write.
    request->setHeaderField("Upgrade", "h2c");

    const Frame frame(configurationToSettingsFrame(config));
    // This we just (re)write.
    request->setHeaderField("HTTP2-Settings", settingsFrameToBase64(frame));
}